

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O0

void __thiscall Database::flush(Database *this,int i)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  void *__dest_02;
  void *__dest_03;
  void *__dest_04;
  int in_ESI;
  long in_RDI;
  uint32_t *a_lineitemposition_mmap;
  uint32_t *a_orderkey_mmap;
  uint32_t *a_extendedpricesum_mmap;
  uint16_t *a_maxshipdate_mmap;
  uint16_t *a_minshipdate_mmap;
  uint16_t *a_orderdate_mmap;
  uint32_t size;
  int a_lineitemposition_fd;
  int a_orderkey_fd;
  int a_extendedpricesum_fd;
  int a_maxshipdate_fd;
  int a_minshipdate_fd;
  int a_orderdate_fd;
  undefined8 in_stack_fffffffffffffe70;
  char cVar4;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  string local_100 [36];
  int local_dc;
  string local_d8 [36];
  int local_b4;
  string local_b0 [36];
  int local_8c;
  string local_88 [36];
  int local_64;
  string local_60 [32];
  int local_40;
  string local_30 [32];
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  util::IntToChar(in_ESI);
  cVar4 = (char)((ulong)in_stack_fffffffffffffe70 >> 0x38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),cVar4);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar3,0x42,0x1ff);
  std::__cxx11::string::~string(local_30);
  local_10 = iVar1;
  util::IntToChar(local_c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),cVar4);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar3,0x42,0x1ff);
  std::__cxx11::string::~string(local_60);
  local_40 = iVar1;
  util::IntToChar(local_c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),cVar4);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar3,0x42,0x1ff);
  std::__cxx11::string::~string(local_88);
  local_64 = iVar1;
  util::IntToChar(local_c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),cVar4);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar3,0x42,0x1ff);
  std::__cxx11::string::~string(local_b0);
  local_8c = iVar1;
  util::IntToChar(local_c);
  cVar4 = (char)((ulong)local_d8 >> 0x38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),cVar4);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar3,0x42,0x1ff);
  std::__cxx11::string::~string(local_d8);
  local_b4 = iVar1;
  util::IntToChar(local_c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffe78),cVar4);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar3,0x42,0x1ff);
  std::__cxx11::string::~string(local_100);
  uVar2 = **(int **)(in_RDI + 0xb8 + (long)local_c * 8) + 1;
  local_dc = iVar1;
  fallocate(local_10,0,0,(ulong)uVar2 << 1);
  fallocate(local_40,0,0,(ulong)uVar2 << 1);
  fallocate(local_64,0,0,(ulong)uVar2 << 1);
  fallocate(local_8c,0,0,(ulong)uVar2 << 2);
  fallocate(local_b4,0,0,(ulong)uVar2 << 2);
  fallocate(local_dc,0,0,(ulong)uVar2 << 2);
  __dest = mmap((void *)0x0,(ulong)uVar2 << 1,3,1,local_10,0);
  __dest_00 = mmap((void *)0x0,(ulong)uVar2 << 1,3,1,local_40,0);
  __dest_01 = mmap((void *)0x0,(ulong)uVar2 << 1,3,1,local_64,0);
  __dest_02 = mmap((void *)0x0,(ulong)uVar2 << 2,3,1,local_8c,0);
  __dest_03 = mmap((void *)0x0,(ulong)uVar2 << 2,3,1,local_b4,0);
  __dest_04 = mmap((void *)0x0,(ulong)uVar2 << 2,3,1,local_dc,0);
  memcpy(__dest,*(void **)(in_RDI + 0x18 + (long)local_c * 8),(ulong)uVar2 << 1);
  memcpy(__dest_00,*(void **)(in_RDI + 0x40 + (long)local_c * 8),(ulong)uVar2 << 1);
  memcpy(__dest_01,*(void **)(in_RDI + 0x68 + (long)local_c * 8),(ulong)uVar2 << 1);
  memcpy(__dest_02,*(void **)(in_RDI + 0x90 + (long)local_c * 8),(ulong)uVar2 << 2);
  memcpy(__dest_03,*(void **)(in_RDI + 0xb8 + (long)local_c * 8),(ulong)uVar2 << 2);
  memcpy(__dest_04,*(void **)(in_RDI + 0xe0 + (long)local_c * 8),(ulong)uVar2 << 2);
  close(local_10);
  close(local_40);
  close(local_64);
  close(local_8c);
  close(local_b4);
  close(local_dc);
  std::__atomic_base<unsigned_char>::operator--((__atomic_base<unsigned_char> *)(in_RDI + 0x108));
  return;
}

Assistant:

void Database::flush(int i) {

  auto a_orderdate_fd = open((A_ORDERDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_minshipdate_fd = open((A_MINSHIPDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_maxshipdate_fd = open((A_MAXSHIPDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_extendedpricesum_fd = open((A_EXTENDEDPRICESUM_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_orderkey_fd = open((A_ORDERKEY_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_lineitemposition_fd = open((A_LINEITEMPOSITION_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);

  auto size = a_orderkey[i][0] + 1;

  fallocate(a_orderdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_minshipdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_maxshipdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_extendedpricesum_fd, 0, 0, size * sizeof(uint32_t));
  fallocate(a_orderkey_fd, 0, 0, size * sizeof(uint32_t));
  fallocate(a_lineitemposition_fd, 0, 0, size * sizeof(uint32_t));

  auto a_orderdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_orderdate_fd, 0);
  auto a_minshipdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_minshipdate_fd, 0);
  auto a_maxshipdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_maxshipdate_fd, 0);
  auto a_extendedpricesum_mmap = (uint32_t *) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_extendedpricesum_fd, 0);
  auto a_orderkey_mmap = (uint32_t*) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_orderkey_fd, 0);
  auto a_lineitemposition_mmap = (uint32_t*) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_lineitemposition_fd, 0);

  memcpy(a_orderdate_mmap, a_orderdate[i], size * sizeof(uint16_t));
  memcpy(a_minshipdate_mmap, a_minshipdate[i], size * sizeof(uint16_t));
  memcpy(a_maxshipdate_mmap, a_maxshipdate[i], size * sizeof(uint16_t));
  memcpy(a_extendedpricesum_mmap, a_extendedpricesum[i], size * sizeof(uint32_t));
  memcpy(a_orderkey_mmap, a_orderkey[i], size * sizeof(uint32_t));
  memcpy(a_lineitemposition_mmap, a_lineitemposition[i], size * sizeof(uint32_t));

  close(a_orderdate_fd);
  close(a_minshipdate_fd);
  close(a_maxshipdate_fd);
  close(a_extendedpricesum_fd);
  close(a_orderkey_fd);
  close(a_lineitemposition_fd);

  --pending;
}